

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::TSPI_PDU::SetSystemSpecificDataFlag(TSPI_PDU *this,KBOOL F)

{
  KUINT16 KVar1;
  
  if ((((this->m_TSPIFlagUnion).m_ui8Flag & 0x40) == 0) == F) {
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag & 0xbf | F << 6;
    KVar1 = (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    if (F) {
      KVar1 = KVar1 + 1;
    }
    else {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = KVar1 - 1;
      KVar1 = (KVar1 + ((short)*(undefined4 *)
                                &(this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_start -
                       (short)*(undefined4 *)
                               &(this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_finish)) - 1;
    }
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = KVar1;
  }
  return;
}

Assistant:

void TSPI_PDU::SetSystemSpecificDataFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_TSPIFlagUnion.m_ui8Data )return;

    m_TSPIFlagUnion.m_ui8Data = F;

    if( F )
    {
        m_ui16PDULength += 1; // 1 = size of data length var.
    }
    else
    {
        m_ui16PDULength -= 1;

        // Remove data size
        m_ui16PDULength -= m_vSSD.size();
    }
}